

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::OrphanBuilder::initList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,ElementSize elementSize)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  AllocateResult AVar5;
  anon_class_1_0_00000001 local_31;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (0x1fffffff < elementCount) {
    anon_func::anon_class_1_0_00000001::operator()(&local_31);
  }
  uVar4 = (ulong)elementCount *
          (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)(uint)elementSize * 4)
          + 0x3f >> 6;
  if (arena == (BuilderArena *)0x0) {
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
        (int)(__return_storage_ptr__->tag).content != 0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
    }
    uVar4 = uVar4 & 0xffffffff;
    if ((long)((_DAT_00000018 * 8 + _DAT_00000010) - _DAT_00000028) >> 3 < (long)uVar4) {
      uVar3 = 0;
    }
    else {
      uVar3 = _DAT_00000028;
      _DAT_00000028 = _DAT_00000028 + uVar4 * 8;
    }
    iVar2 = ((uint)(uVar3 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    AVar5 = (AllocateResult)(auVar1 << 0x40);
  }
  else {
    AVar5 = BuilderArena::allocate(arena,(SegmentWordCount)uVar4);
    iVar2 = -3;
  }
  *(int *)&(__return_storage_ptr__->tag).content = iVar2;
  *(ElementCount *)((long)&(__return_storage_ptr__->tag).content + 4) =
       elementCount << 3 | (uint)elementSize;
  __return_storage_ptr__->segment = AVar5.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location =
       AVar5.words + ((ulong)(AVar5.words == (word *)0x0 || elementSize != INLINE_COMPOSITE) - 1);
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, ElementSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}